

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

word Extra_Truth6MinimumExact(word t,int *pComp,int *pPerm)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  byte bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  uVar3 = 0xffffffffffffffff;
  uVar6 = 0;
  bVar2 = true;
  do {
    bVar5 = bVar2;
    lVar9 = 0;
    uVar10 = uVar6 ^ t;
    do {
      lVar7 = 0;
      uVar8 = uVar10;
      do {
        iVar1 = pComp[lVar7];
        if (5 < (long)iVar1) {
          __assert_fail("v < 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                        ,0x8f1,"word Extra_Truth6ChangePhase(word, int)");
        }
        if (uVar8 <= uVar3) {
          uVar3 = uVar8;
        }
        bVar4 = (byte)(1 << ((byte)iVar1 & 0x1f));
        uVar8 = (*(ulong *)(Extra_Truth6ChangePhase_Truth6 + (long)iVar1 * 8) & uVar8) >>
                (bVar4 & 0x3f) |
                (~*(ulong *)(Extra_Truth6ChangePhase_Truth6 + (long)iVar1 * 8) & uVar8) <<
                (bVar4 & 0x3f);
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x40);
      if (uVar10 != uVar8) {
        __assert_fail("tTemp2 == tCur",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x907,"word Extra_Truth6MinimumExact(word, int *, int *)");
      }
      lVar7 = (long)pPerm[lVar9];
      if (4 < lVar7) {
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                      ,0x8e3,"word Extra_Truth6SwapAdjacent(word, int)");
      }
      bVar4 = (byte)(1 << ((byte)pPerm[lVar9] & 0x1f));
      uVar10 = (uVar10 & *(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18 + 0x10)) >>
               (bVar4 & 0x3f) |
               (*(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18 + 8) & uVar10) <<
               (bVar4 & 0x3f) | *(ulong *)(Extra_Truth6SwapAdjacent_PMasks + lVar7 * 0x18) & uVar10;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x2d0);
    if ((uVar6 ^ t) != uVar10) {
      __assert_fail("tTemp1 == tCur",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                    ,0x90a,"word Extra_Truth6MinimumExact(word, int *, int *)");
    }
    uVar6 = 0xffffffffffffffff;
    bVar2 = false;
  } while (bVar5);
  return uVar3;
}

Assistant:

word Extra_Truth6MinimumExact( word t, int * pComp, int * pPerm )
{
    word tMin = ~(word)0;
    word tCur, tTemp1, tTemp2;
    int i, p, c;
    for ( i = 0; i < 2; i++ )
    {
        tCur = i ? ~t : t;
        tTemp1 = tCur;
        for ( p = 0; p < 720; p++ )
        {
//            printf( "Trying perm %d:\n", p );
//            Kit_DsdPrintFromTruth( &tCur, 6 ), printf( "\n" );;
            tTemp2 = tCur;
            for ( c = 0; c < 64; c++ )
            {
                tMin = Abc_MinWord( tMin, tCur );
                tCur = Extra_Truth6ChangePhase( tCur, pComp[c] );
            }
            assert( tTemp2 == tCur );
            tCur = Extra_Truth6SwapAdjacent( tCur, pPerm[p] );
        }
        assert( tTemp1 == tCur );
    }
    return tMin;
}